

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lodepng.cpp
# Opt level: O0

uint lodepng_load_file(uchar **out,size_t *outsize,char *filename)

{
  FILE *__stream;
  size_t __n;
  void *pvVar1;
  size_t sVar2;
  char *in_RDX;
  size_t *in_RSI;
  long *in_RDI;
  long size;
  FILE *file;
  uint local_4;
  
  *in_RDI = 0;
  *in_RSI = 0;
  __stream = fopen(in_RDX,"rb");
  if (__stream == (FILE *)0x0) {
    local_4 = 0x4e;
  }
  else {
    fseek(__stream,0,2);
    __n = ftell(__stream);
    rewind(__stream);
    *in_RSI = 0;
    pvVar1 = lodepng_malloc(0x2ae358);
    *in_RDI = (long)pvVar1;
    if ((__n != 0) && (*in_RDI != 0)) {
      sVar2 = fread((void *)*in_RDI,1,__n,__stream);
      *in_RSI = sVar2;
    }
    fclose(__stream);
    if ((*in_RDI == 0) && (__n != 0)) {
      local_4 = 0x53;
    }
    else {
      local_4 = 0;
    }
  }
  return local_4;
}

Assistant:

unsigned lodepng_load_file(unsigned char** out, size_t* outsize, const char* filename)
{
  FILE* file;
  long size;

  /*provide some proper output values if error will happen*/
  *out = 0;
  *outsize = 0;

  file = fopen(filename, "rb");
  if(!file) return 78;

  /*get filesize:*/
  fseek(file , 0 , SEEK_END);
  size = ftell(file);
  rewind(file);

  /*read contents of the file into the vector*/
  *outsize = 0;
  *out = (unsigned char*)lodepng_malloc((size_t)size);
  if(size && (*out)) (*outsize) = fread(*out, 1, (size_t)size, file);

  fclose(file);
  if(!(*out) && size) return 83; /*the above malloc failed*/
  return 0;
}